

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_graph_algorithms.cpp
# Opt level: O3

unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
* __thiscall
geometrycentral::surface::vertexDijkstraDistanceWithinRadius
          (unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
           *__return_storage_ptr__,surface *this,IntrinsicGeometryInterface *geom,Vertex startVert,
          double ballRad)

{
  bool bVar1;
  unsigned_long uVar2;
  Etype firstE_;
  undefined8 uVar3;
  ParentMeshT *pPVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  __node_base_ptr p_Var8;
  mapped_type *pmVar9;
  pointer puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  byte bVar15;
  ParentMeshT *pPVar16;
  ulong uVar17;
  Vertex currVert;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  toProcess;
  double targetDist;
  Vertex targetVert;
  key_type local_138;
  surface *local_128;
  mapped_type local_120;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  local_118;
  ulong local_f0;
  double local_e8;
  double local_e0;
  key_type local_d8;
  size_t sStack_c8;
  undefined1 uStack_c0;
  uint7 uStack_bf;
  ParentMeshT *local_b8;
  size_t local_b0;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_a8;
  Vertex local_40;
  
  local_40.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  ind = (size_t)startVert.
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh;
  local_128 = this;
  local_e8 = ballRad;
  local_40.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = (ParentMeshT *)geom;
  IntrinsicGeometryInterface::requireEdgeLengths((IntrinsicGeometryInterface *)this);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_118.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.firstE._0_8_ = 0;
  ::std::
  priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
  ::emplace<double,geometrycentral::surface::Vertex&>
            ((priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
              *)&local_118,(double *)&local_a8,&local_40);
  if (local_118.c.
      super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_118.c.
      super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_120 = ((local_118.c.
                    super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
                  super__Head_base<0UL,_double,_false>._M_head_impl;
      local_138.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           ((local_118.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
           super__Tuple_impl<1UL,_geometrycentral::surface::Vertex>.
           super__Head_base<1UL,_geometrycentral::surface::Vertex,_false>._M_head_impl.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           mesh;
      local_138.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           ((local_118.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
           super__Tuple_impl<1UL,_geometrycentral::surface::Vertex>.
           super__Head_base<1UL,_geometrycentral::surface::Vertex,_false>._M_head_impl.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
      ::std::
      priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ::pop(&local_118);
      p_Var8 = ::std::
               _Hashtable<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (&__return_storage_ptr__->_M_h,
                          local_138.
                          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                          .ind % (__return_storage_ptr__->_M_h)._M_bucket_count,&local_138,
                          local_138.
                          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                          .ind);
      if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
        pmVar9 = ::std::__detail::
                 _Map_base<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)__return_storage_ptr__,&local_138);
        *pmVar9 = local_120;
        sStack_c8 = ((local_138.
                      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     .mesh)->vHalfedgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_138.
                     super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     .ind];
        local_d8.
        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
             = (ParentMeshT *)
               CONCAT71(local_d8.
                        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                        .mesh._1_7_,
                        (local_138.
                         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                        .mesh)->useImplicitTwinFlag);
        local_d8.
        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
             (size_t)local_138.
                     super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                     .mesh;
        uStack_c0 = 0;
        local_b8 = local_138.
                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                   .mesh;
        firstE_.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_138.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        firstE_._0_8_ =
             local_d8.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
             mesh;
        firstE_.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = sStack_c8;
        firstE_._24_8_ = (ulong)uStack_bf << 8;
        firstE_.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_138.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        firstE_.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = sStack_c8;
        local_b0 = sStack_c8;
        NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::NavigationSetBase
                  (&local_a8,firstE_);
        bVar6 = local_a8.cachedEndIter.justStarted;
        bVar5 = local_a8.cachedEndIter.state.currE.processingIncoming;
        pPVar4 = local_a8.firstE.firstHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
        uVar3 = local_a8.firstE._0_8_;
        bVar7 = true;
        uVar17 = local_a8.firstE.currHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        uVar14 = local_a8.firstE.firstHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        pPVar16 = local_a8.firstE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        bVar15 = local_a8.firstE.processingIncoming;
        if ((local_a8.firstE._0_8_ & 1) == 0) {
          do {
            bVar1 = pPVar16->useImplicitTwinFlag;
            if (bVar1 == true) {
              uVar12 = uVar17 & 0xfffffffffffffffe;
            }
            else {
              uVar12 = (pPVar16->eHalfedgeArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(pPVar16->heEdgeArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar17]];
            }
            if (uVar17 == uVar12) goto LAB_001a8009;
            if ((bVar15 & 1) == 0) {
              puVar13 = (pPVar16->heVertOutNextArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar17;
              if (bVar1 != false) {
                puVar13 = (pPVar16->heNextArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar17 ^ 1);
              }
              uVar17 = *puVar13;
              if (uVar17 == uVar14) {
                uVar12 = uVar14;
                do {
                  uVar17 = uVar12;
                  uVar12 = ((local_a8.firstE.firstHe.
                             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .mesh)->heNextArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar17];
                } while (uVar12 != uVar14);
                bVar15 = 1;
                uVar14 = uVar17;
                pPVar16 = local_a8.firstE.firstHe.
                          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh;
              }
            }
            else {
              if (bVar1 == false) {
                uVar17 = (pPVar16->heVertInNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17];
              }
              else {
                uVar17 = (pPVar16->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17] ^ 1;
              }
              if (uVar17 == uVar14) {
                bVar15 = 0;
                uVar17 = ((local_a8.firstE.firstHe.
                           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14];
                uVar14 = uVar17;
                pPVar16 = local_a8.firstE.firstHe.
                          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh;
              }
            }
          } while ((uVar17 != local_a8.firstE.currHe.
                              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                              .ind) || ((bool)bVar15 != local_a8.firstE.processingIncoming));
          bVar7 = false;
          uVar17 = local_a8.firstE.currHe.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind;
        }
LAB_001a8009:
        local_f0 = local_a8.cachedEndIter.state.currE.currHe.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind;
        while (((bVar7 != bVar6 || (uVar17 != local_f0)) || ((bool)bVar15 != bVar5))) {
          if (pPVar16->useImplicitTwinFlag == true) {
            local_e0 = *(double *)(*(long *)(local_128 + 0x380) + (uVar17 >> 1) * 8);
            puVar10 = (pPVar16->heVertexArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar12 = puVar10[(uVar17 >> 1) * 2];
            uVar11 = uVar17 & 0xfffffffffffffffe;
          }
          else {
            uVar2 = (pPVar16->heEdgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar17];
            local_e0 = *(double *)(*(long *)(local_128 + 0x380) + uVar2 * 8);
            puVar10 = (pPVar16->heVertexArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar11 = (pPVar16->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar2];
            uVar12 = puVar10[uVar11];
          }
          if (uVar12 == local_138.
                        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                        .ind) {
            uVar11 = (pPVar16->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11];
          }
          local_e0 = local_e0 + local_120;
          local_d8.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = puVar10[uVar11];
          local_d8.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = pPVar16;
          if ((local_e0 <= local_e8) &&
             ((p_Var8 = ::std::
                        _Hashtable<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::_M_find_before_node
                                  (&__return_storage_ptr__->_M_h,
                                   local_d8.
                                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                                   .ind % (__return_storage_ptr__->_M_h)._M_bucket_count,&local_d8,
                                   local_d8.
                                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                                   .ind), p_Var8 == (__node_base_ptr)0x0 ||
              (p_Var8->_M_nxt == (_Hash_node_base *)0x0)))) {
            ::std::
            priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
            ::emplace<double&,geometrycentral::surface::Vertex&>
                      ((priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
                        *)&local_118,&local_e0,&local_d8);
          }
          if ((uVar3 & 1) == 0) {
            if ((bVar15 & 1) == 0) {
              puVar13 = (pPVar16->heVertOutNextArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar17;
              if (pPVar16->useImplicitTwinFlag != false) {
                puVar13 = (pPVar16->heNextArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar17 ^ 1);
              }
              uVar17 = *puVar13;
              if (uVar17 != uVar14) goto LAB_001a8205;
              uVar17 = uVar14;
              do {
                uVar12 = uVar17;
                uVar17 = (pPVar4->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12];
                if (uVar17 == uVar14) goto LAB_001a82b4;
              } while( true );
            }
            if (pPVar16->useImplicitTwinFlag == false) {
              uVar17 = (pPVar16->heVertInNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17];
            }
            else {
              uVar17 = (pPVar16->heNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17] ^ 1;
            }
            if (uVar17 != uVar14) goto LAB_001a8205;
LAB_001a81ef:
            bVar15 = 0;
            uVar14 = (pPVar4->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
            pPVar16 = pPVar4;
            uVar17 = uVar14;
LAB_001a8205:
            do {
              bVar7 = pPVar16->useImplicitTwinFlag;
              do {
                while( true ) {
                  if (bVar7 == false) {
                    uVar12 = (pPVar16->eHalfedgeArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [(pPVar16->heEdgeArr).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar17]];
                  }
                  else {
                    uVar12 = uVar17 & 0xfffffffffffffffe;
                  }
                  if (uVar17 == uVar12) goto LAB_001a816b;
                  if ((bVar15 & 1) == 0) break;
                  if (bVar7 == false) {
                    uVar17 = (pPVar16->heVertInNextArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar17];
                  }
                  else {
                    uVar17 = (pPVar16->heNextArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar17] ^ 1;
                  }
                  if (uVar17 == uVar14) goto LAB_001a81ef;
                }
                puVar13 = (pPVar16->heVertOutNextArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar17;
                if (bVar7 != false) {
                  puVar13 = (pPVar16->heNextArr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + (uVar17 ^ 1);
                }
                uVar17 = *puVar13;
              } while (uVar17 != uVar14);
              uVar17 = uVar14;
              do {
                uVar12 = uVar17;
                uVar17 = (pPVar4->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12];
              } while (uVar17 != uVar14);
LAB_001a82b4:
              uVar14 = uVar12;
              bVar15 = 1;
              pPVar16 = pPVar4;
              uVar17 = uVar14;
            } while( true );
          }
          puVar13 = (pPVar16->heVertOutNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar17;
          if (pPVar16->useImplicitTwinFlag != false) {
            puVar13 = (pPVar16->heNextArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + (uVar17 ^ 1);
          }
          uVar17 = *puVar13;
LAB_001a816b:
          bVar7 = false;
        }
      }
    } while (local_118.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_118.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_118.c.
      super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.c.
                    super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<Vertex, double> vertexDijkstraDistanceWithinRadius(IntrinsicGeometryInterface& geom,
                                                                      Vertex startVert, double ballRad) {

  // Gather values
  SurfaceMesh& mesh = geom.mesh;
  geom.requireEdgeLengths();

  // Search state: incoming halfedges to each vertex, once discovered
  std::unordered_map<Vertex, double> shortestDist;

  // Search state: visible neighbors eligible to expand to
  using WeightedVertex = std::tuple<double, Vertex>;
  std::priority_queue<WeightedVertex, std::vector<WeightedVertex>, std::greater<WeightedVertex>> toProcess;

  // Add initial source
  toProcess.emplace(0., startVert);

  while (!toProcess.empty()) {

    // Get the next closest neighbor off the queue
    double currDist = std::get<0>(toProcess.top());
    Vertex currVert = std::get<1>(toProcess.top());
    toProcess.pop();

    // skips stale entries
    if (shortestDist.find(currVert) != shortestDist.end()) continue;

    shortestDist[currVert] = currDist;

    for (Edge e : currVert.adjacentEdges()) {
      double len = geom.edgeLengths[e];
      Vertex targetVert = e.otherVertex(currVert);
      double targetDist = currDist + len;

      if (targetDist <= ballRad && shortestDist.find(targetVert) == shortestDist.end()) {
        toProcess.emplace(targetDist, targetVert);
      }
    }
  }

  return shortestDist;
}